

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O0

idx_t __thiscall
duckdb::StructColumnData::Scan
          (StructColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,idx_t target_count)

{
  TransactionData transaction_00;
  Vector *pVVar1;
  Vector *pVVar2;
  bool bVar3;
  idx_t iVar4;
  size_type sVar5;
  type pVVar6;
  pointer pCVar7;
  reference pvVar8;
  ColumnData *in_RSI;
  ColumnScanState *in_RDI;
  undefined8 in_R8;
  Vector *in_stack_00000008;
  Vector *in_stack_00000010;
  Vector *target_vector;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *child_entries;
  idx_t scan_count;
  size_type in_stack_ffffffffffffff28;
  Vector *__n;
  vector<duckdb::ColumnScanState,_true> *in_stack_ffffffffffffff30;
  Vector *this_00;
  idx_t in_stack_ffffffffffffff50;
  ulong uVar9;
  Vector *result_00;
  optional_ptr<duckdb::TableScanOptions,_true> *vector_index_00;
  ColumnData *this_01;
  Vector *in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  _Bit_type *in_stack_ffffffffffffff90;
  ulong local_58;
  
  result_00 = (Vector *)&stack0x00000008;
  vector_index_00 = &in_RDI[1].scan_options;
  this_01 = in_RSI;
  vector<duckdb::ColumnScanState,_true>::operator[]
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  transaction_00.transaction_id = in_stack_ffffffffffffff88;
  transaction_00.transaction.ptr = (DuckTransaction *)in_stack_ffffffffffffff80;
  transaction_00.start_time = (transaction_t)in_stack_ffffffffffffff90;
  iVar4 = ColumnData::Scan(this_01,transaction_00,(idx_t)vector_index_00,in_RDI,result_00,
                           in_stack_ffffffffffffff50);
  StructVector::GetEntries(in_stack_00000008);
  local_58 = 0;
  __n = in_stack_00000008;
  this_00 = in_stack_00000010;
  while( true ) {
    uVar9 = local_58;
    sVar5 = ::std::
            vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                    *)&in_RDI[1].scan_child_column.super_vector<bool,_std::allocator<bool>_>.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_finish);
    if (sVar5 <= uVar9) break;
    vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
    operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                *)this_00,(size_type)__n);
    pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        this_00);
    vector<bool,_true>::operator[]((vector<bool,_true> *)this_00,(size_type)__n);
    bVar3 = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff90)
    ;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                    *)this_00,(size_type)__n);
      pCVar7 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                           *)this_00);
      pVVar1 = *(Vector **)result_00;
      pVVar2 = *(Vector **)&result_00->type;
      pvVar8 = vector<duckdb::ColumnScanState,_true>::operator[]
                         ((vector<duckdb::ColumnScanState,_true> *)this_00,(size_type)__n);
      this_00 = pVVar2;
      __n = pVVar1;
      in_stack_ffffffffffffff78 = __n;
      in_stack_ffffffffffffff80 = this_00;
      (*pCVar7->_vptr_ColumnData[9])(pCVar7,in_RSI,pvVar8,pVVar6,in_R8);
    }
    else {
      Vector::SetVectorType((Vector *)in_RDI,(VectorType)((ulong)result_00 >> 0x38));
      ConstantVector::SetNull
                (in_stack_ffffffffffffff80,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
    }
    local_58 = local_58 + 1;
  }
  return iVar4;
}

Assistant:

idx_t StructColumnData::Scan(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                             idx_t target_count) {
	auto scan_count = validity.Scan(transaction, vector_index, state.child_states[0], result, target_count);
	auto &child_entries = StructVector::GetEntries(result);
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto &target_vector = *child_entries[i];
		if (!state.scan_child_column[i]) {
			// if we are not scanning this vector - set it to NULL
			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
			continue;
		}
		sub_columns[i]->Scan(transaction, vector_index, state.child_states[i + 1], target_vector, target_count);
	}
	return scan_count;
}